

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
Shell::addModule(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,WASTModule *mod)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  _Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *p_Var7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  __index_type *p_Var11;
  __index_type *p_Var12;
  Module *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  undefined1 local_e0 [8];
  Result<std::shared_ptr<wasm::Module>_> module;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  Name *local_90;
  undefined1 local_88 [8];
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  _val_2;
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  instanceInfo;
  
  makeModule((Result<std::shared_ptr<wasm::Module>_> *)local_e0,this,mod);
  std::__detail::__variant::_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)
                  ((long)&_val_2.val.
                          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  + 0x20),(_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)
                          local_e0);
  if (instanceInfo.val.
      super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&_val_2.val.
                     super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             + 8);
    local_88 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,
               _val_2.val.
               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               ._32_8_,instanceInfo.val.
                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       ._M_u._0_8_ +
                       _val_2.val.
                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       ._32_8_);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if (local_88 == (undefined1  [8])puVar1) {
      *puVar2 = _val_2.val.
                super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                .
                super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                .
                super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                .
                super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                .
                super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                ._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val_2.val.
           super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           ._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_88;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           _val_2.val.
           super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           ._M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val_2.val.
         super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
         .
         super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
         .
         super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
         .
         super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
         .
         super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
         .
         super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
         ._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)
                      ((long)&_val_2.val.
                              super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)
                      ((long)&_val_2.val.
                              super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      + 0x20));
    p_Var7 = (_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)0x0;
    if (module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_u._24_1_ == '\0')
    {
      p_Var7 = (_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)local_e0;
    }
    p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(p_Var7->
                       super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>)._M_u
               + 8);
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      }
    }
    validateModule((Result<wasm::Ok> *)
                   ((long)&_val_2.val.
                           super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                   + 0x20),this,(Module *)local_e0);
    if (instanceInfo.val.
        super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
      puVar1 = (undefined1 *)
               ((long)&_val_2.val.
                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               + 8);
      local_88 = (undefined1  [8])puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,
                 _val_2.val.
                 super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 ._32_8_,instanceInfo.val.
                         super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         ._M_u._0_8_ +
                         _val_2.val.
                         super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         ._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if (local_88 == (undefined1  [8])puVar1) {
        *puVar2 = _val_2.val.
                  super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  ._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             _val_2.val.
             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_88;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             _val_2.val.
             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
             ._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           _val_2.val.
           super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
           ._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 + 0x20));
      instantiate((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                   *)((long)&_val_2.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     + 0x20),this,(Module *)local_e0);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         *)local_88,
                        (_Copy_ctor_base<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         *)((long)&_val_2.val.
                                   super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           + 0x20));
      if (_val_2.val.
          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
        module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ = &local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20),
                   local_88,(undefined1 *)
                            (_val_2.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             ._M_u._0_8_ + (long)local_88));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
        if ((undefined8 *)
            module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ ==
            &local_a8) {
          *puVar2 = local_a8;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_a0;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
               module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_a8;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_b0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             *)local_88);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             *)local_88);
        instanceInfo.val.
        super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ._39_1_ = instanceInfo.val.
                  super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  ._M_u._M_first._M_storage._M_storage[0x18];
        p_Var12 = (__index_type *)0x0;
        if (instanceInfo.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\0') {
          p_Var12 = (__index_type *)
                    ((long)&_val_2.val.
                            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                    + 0x20);
        }
        local_98 = (undefined8 *)0x10;
        if (instanceInfo.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\0') {
          local_98 = (undefined8 *)
                     ((long)&instanceInfo.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     + 8);
        }
        local_90 = &this->lastModule;
        pcVar6 = *(char **)((long)local_e0 + 0x188);
        (this->lastModule).super_IString.str._M_len =
             (((Name *)((long)local_e0 + 0x180))->super_IString).str._M_len;
        (this->lastModule).super_IString.str._M_str = pcVar6;
        pmVar8 = std::
                 map<wasm::Name,_std::shared_ptr<wasm::Module>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>_>
                 ::operator[](&this->modules,local_90);
        (pmVar8->super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)local_e0;
        p_Var3 = (pmVar8->super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        (pmVar8->super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             p_Var13;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        pmVar9 = std::
                 map<wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>_>
                 ::operator[](&this->interfaces,local_90);
        p_Var11 = (__index_type *)0x0;
        if (instanceInfo.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._39_1_ == '\0') {
          p_Var11 = (__index_type *)
                    ((long)&_val_2.val.
                            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                    + 0x20);
        }
        peVar4 = *(element_type **)p_Var12;
        p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var11 + 8);
        *(undefined8 *)p_Var12 = 0;
        *(undefined8 *)(p_Var12 + 8) = 0;
        (pmVar9->super___shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = peVar4;
        p_Var3 = (pmVar9->
                 super___shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (pmVar9->super___shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = p_Var13;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        pmVar10 = std::
                  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
                  ::operator[](&this->instances,local_90);
        p_Var11 = (__index_type *)0x0;
        if (instanceInfo.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._39_1_ == '\0') {
          p_Var11 = (__index_type *)
                    ((long)&_val_2.val.
                            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                    + 0x20);
        }
        peVar5 = *(element_type **)(p_Var12 + 0x10);
        p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var11 + 0x18);
        *local_98 = 0;
        local_98[1] = 0;
        (pmVar10->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             peVar5;
        p_Var3 = (pmVar10->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (pmVar10->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
        _M_pi = p_Var13;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             + 0x20));
    }
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
    }
  }
  std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

Result<> addModule(WASTModule& mod) {
    auto module = makeModule(mod);
    CHECK_ERR(module);

    auto wasm = *module;
    CHECK_ERR(validateModule(*wasm));

    auto instanceInfo = instantiate(*wasm);
    CHECK_ERR(instanceInfo);

    auto& [interface, instance] = *instanceInfo;
    lastModule = wasm->name;
    modules[lastModule] = std::move(wasm);
    interfaces[lastModule] = std::move(interface);
    instances[lastModule] = std::move(instance);

    return Ok{};
  }